

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

loader_impl_data ext_loader_impl_initialize(loader_impl impl,configuration config)

{
  int iVar1;
  loader_impl in_RSI;
  undefined8 in_RDI;
  loader_impl_ext ext_impl;
  loader_impl_ext_type *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  local_8 = (loader_impl_ext_type *)operator_new(0x60);
  memset(local_8,0,0x60);
  loader_impl_ext_type::loader_impl_ext_type(in_stack_ffffffffffffffd0);
  if (local_8 == (loader_impl_ext_type *)0x0) {
    local_8 = (loader_impl_ext_type *)0x0;
  }
  else {
    iVar1 = ext_loader_impl_initialize_types(in_RSI);
    if (iVar1 == 0) {
      loader_initialization_register(in_RDI);
    }
    else {
      if (local_8 != (loader_impl_ext_type *)0x0) {
        loader_impl_ext_type::~loader_impl_ext_type(local_8);
        operator_delete(local_8,0x60);
      }
      local_8 = (loader_impl_ext_type *)0x0;
    }
  }
  return local_8;
}

Assistant:

loader_impl_data ext_loader_impl_initialize(loader_impl impl, configuration config)
{
	loader_impl_ext ext_impl = new loader_impl_ext_type();

	(void)impl;
	(void)config;

	if (ext_impl == nullptr)
	{
		return NULL;
	}

	if (ext_loader_impl_initialize_types(impl) != 0)
	{
		delete ext_impl;

		return NULL;
	}

	/* Register initialization */
	loader_initialization_register(impl);

	return static_cast<loader_impl_data>(ext_impl);
}